

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::
Static_Caster<chaiscript::dispatch::Assignable_Proxy_Function,_chaiscript::dispatch::Proxy_Function_Base>
::cast(Static_Caster<chaiscript::dispatch::Assignable_Proxy_Function,_chaiscript::dispatch::Proxy_Function_Base>
       *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  reference_wrapper<chaiscript::dispatch::Proxy_Function_Base> obj;
  reference_wrapper<const_chaiscript::dispatch::Proxy_Function_Base> obj_00;
  bad_boxed_dynamic_cast *this_00;
  undefined8 *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar6;
  Boxed_Value BVar7;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_48;
  undefined1 local_38 [32];
  
  local_38._0_8_ = &chaiscript::dispatch::Assignable_Proxy_Function::typeinfo;
  local_38._8_8_ = &chaiscript::dispatch::Assignable_Proxy_Function::typeinfo;
  local_38._16_4_ = 0;
  bVar3 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)local_38);
  if (!bVar3) {
    this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x48);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._0_8_ = local_38 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"Unknown dynamic_cast_conversion","");
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (this_00,&peVar2->m_type_info,
               (type_info *)&chaiscript::dispatch::Proxy_Function_Base::typeinfo,(string *)local_38)
    ;
    __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_cast::~bad_boxed_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function>_>::cast
                ((Boxed_Value *)local_38,(Type_Conversions_State *)t_from);
      local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_38._0_8_;
      local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
      if ((element_type *)
          local_48.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PyByteArray_Type;
        __cxa_throw(puVar4,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      sVar6 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
                        ((Object_Data *)this,&local_48,false);
      _Var5 = sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_>::
      cast((Boxed_Value *)local_38,(Type_Conversions_State *)t_from);
      local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_38._0_8_;
      local_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_38._8_8_ + 8) = *(_Atomic_word *)(local_38._8_8_ + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
      if ((element_type *)
          local_48.
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PyByteArray_Type;
        __cxa_throw(puVar4,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      sVar6 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
                        ((Object_Data *)this,
                         (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&local_48,
                         false);
      _Var5 = sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_48.
        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var5._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    obj._M_data = (Proxy_Function_Base *)
                  Cast_Helper_Inner<chaiscript::dispatch::Assignable_Proxy_Function_&>::cast
                            (t_from,(Type_Conversions_State *)0x0);
    sVar6 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
                      ((Object_Data *)this,obj,false);
    _Var5 = sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    obj_00._M_data =
         (Proxy_Function_Base *)
         Cast_Helper_Inner<const_chaiscript::dispatch::Assignable_Proxy_Function_&>::cast
                   (t_from,(Type_Conversions_State *)0x0);
    sVar6 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
                      ((Object_Data *)this,obj_00,false);
    _Var5 = sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = static_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = static_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }